

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

int container_to_uint32_array(uint32_t *output,container_t *c,uint8_t typecode,uint32_t base)

{
  int iVar1;
  run_container_t *cont;
  uint32_t in_ECX;
  undefined1 in_DL;
  container_t *in_RSI;
  void *in_RDI;
  array_container_t *unaff_retaddr;
  undefined3 in_stack_0000000c;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar2;
  uint32_t in_stack_fffffffffffffffc;
  
  uVar2 = CONCAT13(in_DL,in_stack_ffffffffffffffe4);
  cont = (run_container_t *)container_unwrap_shared(in_RSI,&stack0xffffffffffffffe7);
  if (uVar2 >> 0x18 == 1) {
    iVar1 = bitset_container_to_uint32_array
                      ((uint32_t *)cont,(bitset_container_t *)CONCAT44(uVar2,in_ECX),1);
  }
  else if (uVar2 >> 0x18 == 2) {
    iVar1 = array_container_to_uint32_array
                      ((void *)CONCAT44(_in_stack_0000000c,base),unaff_retaddr,
                       in_stack_fffffffffffffffc);
  }
  else {
    iVar1 = run_container_to_uint32_array(in_RDI,cont,in_ECX);
  }
  return iVar1;
}

Assistant:

static inline int container_to_uint32_array(uint32_t *output,
                                            const container_t *c,
                                            uint8_t typecode, uint32_t base) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_to_uint32_array(output,
                                                    const_CAST_bitset(c), base);
        case ARRAY_CONTAINER_TYPE:
            return array_container_to_uint32_array(output, const_CAST_array(c),
                                                   base);
        case RUN_CONTAINER_TYPE:
            return run_container_to_uint32_array(output, const_CAST_run(c),
                                                 base);
    }
    assert(false);
    roaring_unreachable;
    return 0;  // unreached
}